

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O2

void stl_string_contains_string(void)

{
  Constraint_ *pCVar1;
  allocator local_29;
  string bobbob;
  
  std::__cxx11::string::string((string *)&bobbob,"bobbob",&local_29);
  pCVar1 = (Constraint_ *)create_contains_string_constraint("obbo","\"obbo\"");
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x48,"bobbob",(string *)&bobbob,pCVar1);
  std::__cxx11::string::~string((string *)&bobbob);
  return;
}

Assistant:

Ensure(stl_string_contains_string) {
    std::string bobbob("bobbob");
    assert_that(bobbob, contains_string("obbo"));
}